

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O3

Edge * __thiscall S2Polygon::Shape::chain_edge(Edge *__return_storage_ptr__,Shape *this,int i,int j)

{
  pointer puVar1;
  __uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_> this_00;
  VType VVar2;
  S2Point *pSVar3;
  S2Point *pSVar4;
  S2LogMessage SStack_38;
  
  puVar1 = (this->polygon_->loops_).
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (i < (int)((ulong)((long)(this->polygon_->loops_).
                              super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1) >> 3)) {
    this_00._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
    super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl =
         puVar1[i]._M_t.super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t;
    if (j < *(int *)((long)this_00._M_t.
                           super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                           super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 0xc)) {
      pSVar3 = S2Loop::oriented_vertex
                         ((S2Loop *)
                          this_00._M_t.
                          super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                          super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl,j);
      pSVar4 = S2Loop::oriented_vertex
                         ((S2Loop *)
                          (this->polygon_->loops_).
                          super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[i]._M_t.
                          super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t,j + 1);
      VVar2 = pSVar3->c_[1];
      (__return_storage_ptr__->v0).c_[0] = pSVar3->c_[0];
      (__return_storage_ptr__->v0).c_[1] = VVar2;
      (__return_storage_ptr__->v0).c_[2] = pSVar3->c_[2];
      VVar2 = pSVar4->c_[1];
      (__return_storage_ptr__->v1).c_[0] = pSVar4->c_[0];
      (__return_storage_ptr__->v1).c_[1] = VVar2;
      (__return_storage_ptr__->v1).c_[2] = pSVar4->c_[2];
      return __return_storage_ptr__;
    }
    S2LogMessage::S2LogMessage
              (&SStack_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
               ,0x600,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_38.stream_,"Check failed: (j) < (polygon_->loop(i)->num_vertices()) ",0x38);
  }
  else {
    S2LogMessage::S2LogMessage
              (&SStack_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
               ,0x5ff,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_38.stream_,"Check failed: (i) < (Shape::num_chains()) ",0x2a);
  }
  abort();
}

Assistant:

S2Shape::Edge S2Polygon::Shape::chain_edge(int i, int j) const {
  S2_DCHECK_LT(i, Shape::num_chains());
  S2_DCHECK_LT(j, polygon_->loop(i)->num_vertices());
  return Edge(polygon()->loop(i)->oriented_vertex(j),
              polygon()->loop(i)->oriented_vertex(j + 1));
}